

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O2

void TestSingle_IsDenormal(void)

{
  bool in_CL;
  
  CheckHelper((char *)0x8b,0xc1c462,(char *)0x1,in_CL);
  CheckHelper((char *)0x8d,0xc1c484,(char *)0x1,in_CL);
  CheckHelper((char *)0x8f,0xc1c483,(char *)0x1,in_CL);
  return;
}

Assistant:

TEST(Single_IsDenormal) {
  uint32_t min_float32 = 0x00000001;
  CHECK(Single(min_float32).IsDenormal());
  uint32_t bits = 0x007FFFFF;
  CHECK(Single(bits).IsDenormal());
  bits = 0x00800000;
  CHECK(!Single(bits).IsDenormal());
}